

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_compact.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::AssertionPrinter::printResultType
          (AssertionPrinter *this,Code colour,string *passOrFail)

{
  ulong uVar1;
  ostream *poVar2;
  Colour local_21;
  string *psStack_20;
  Colour colourGuard;
  string *passOrFail_local;
  Code colour_local;
  AssertionPrinter *this_local;
  
  psStack_20 = passOrFail;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Colour::Colour(&local_21,colour);
    poVar2 = std::operator<<(this->stream," ");
    std::operator<<(poVar2,(string *)passOrFail);
    Colour::~Colour(&local_21);
    std::operator<<(this->stream,":");
  }
  return;
}

Assistant:

void printResultType( Colour::Code colour, std::string passOrFail ) const {
                if( !passOrFail.empty() ) {
                    {
                        Colour colourGuard( colour );
                        stream << " " << passOrFail;
                    }
                    stream << ":";
                }
            }